

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O1

void __thiscall
cmCommandArgument::FollowsGroup(cmCommandArgument *this,cmCommandArgumentGroup *group)

{
  pointer ppcVar1;
  pointer __args;
  
  if (group != (cmCommandArgumentGroup *)0x0) {
    this->ArgumentsBeforeEmpty = false;
    __args = (group->ContainedArguments).
             super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppcVar1 = (group->ContainedArguments).
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__args != ppcVar1) {
      do {
        std::
        _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
        ::_M_emplace_unique<cmCommandArgument*const&>
                  ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
                    *)&this->ArgumentsBefore,__args);
        __args = __args + 1;
      } while (__args != ppcVar1);
    }
  }
  return;
}

Assistant:

void cmCommandArgument::FollowsGroup(const cmCommandArgumentGroup* group)
{
  if (group != nullptr) {
    this->ArgumentsBeforeEmpty = false;
    this->ArgumentsBefore.insert(group->ContainedArguments.begin(),
                                 group->ContainedArguments.end());
  }
}